

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
duckdb_re2::RE2::DoMatch
          (RE2 *this,StringPiece *text,Anchor re_anchor,size_t *consumed,Arg **args,int n)

{
  ostringstream *this_00;
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  StringPiece *submatch;
  ulong uVar4;
  uint nsubmatch;
  StringPiece *pSVar5;
  ulong uVar6;
  StringPiece stkvec [17];
  undefined1 local_1b8 [392];
  
  if ((*(uint *)&this->field_0x44 & 0x1fffffff) == 0) {
    if (n <= this->num_captures_) {
      submatch = (StringPiece *)local_1b8;
      memset(submatch,0,0x110);
      nsubmatch = n + 1U;
      if (n == 0) {
        nsubmatch = 0;
      }
      if (consumed != (size_t *)0x0) {
        nsubmatch = n + 1U;
      }
      if ((int)nsubmatch < 0x12) {
        pSVar5 = (StringPiece *)0x0;
      }
      else {
        submatch = (StringPiece *)operator_new__((ulong)nsubmatch << 4);
        memset(submatch,0,(ulong)nsubmatch << 4);
        pSVar5 = submatch;
      }
      bVar1 = Match(this,text,0,text->size_,re_anchor,submatch,nsubmatch);
      if (bVar1) {
        if (consumed != (size_t *)0x0) {
          *consumed = (size_t)(submatch->data_ + (submatch->size_ - (long)text->data_));
        }
        if (args == (Arg **)0x0 || n == 0) {
          bVar1 = true;
        }
        else {
          uVar6 = 0;
          uVar4 = (ulong)(uint)n;
          if (n < 1) {
            uVar4 = uVar6;
          }
          do {
            if (uVar4 * 8 == uVar6) {
              bVar1 = true;
              goto joined_r0x00405a5d;
            }
            cVar2 = (*(code *)(*(undefined8 **)((long)args + uVar6))[1])
                              (*(undefined8 *)((long)&submatch[1].data_ + uVar6 * 2),
                               *(undefined8 *)((long)&submatch[1].size_ + uVar6 * 2),
                               **(undefined8 **)((long)args + uVar6));
            uVar6 = uVar6 + 8;
          } while (cVar2 != '\0');
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
joined_r0x00405a5d:
      if (pSVar5 == (StringPiece *)0x0) {
        return bVar1;
      }
      operator_delete__(pSVar5);
      return bVar1;
    }
  }
  else if ((this->options_).log_errors_ == true) {
    this_00 = (ostringstream *)(local_1b8 + 8);
    local_1b8[0] = 0;
    std::__cxx11::ostringstream::ostringstream(this_00);
    poVar3 = std::operator<<((ostream *)this_00,"Invalid RE2: ");
    std::operator<<(poVar3,(string *)this->error_);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return false;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor re_anchor,
                  size_t* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (NumberOfCapturingGroups() < n) {
    // RE has fewer capturing groups than number of Arg pointers passed in.
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= static_cast<int>(arraysize(stkvec))) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), re_anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<size_t>(EndPtr(vec[0]) - BeginPtr(text));

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}